

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov2.cpp
# Opt level: O0

int detect_yolov2(Mat *bgr,vector<Object,_std::allocator<Object>_> *objects)

{
  vector<Object,_std::allocator<Object>_> *this;
  Object object;
  float *values;
  int i;
  Mat out;
  Extractor ex;
  float norm_vals [3];
  float mean_vals [3];
  Mat in;
  int img_h;
  int img_w;
  int target_size;
  Net yolov2;
  float *in_stack_00000330;
  float *in_stack_00000338;
  Mat *in_stack_00000340;
  Net *pNVar1;
  Net *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  Extractor *in_stack_fffffffffffffeb8;
  int local_13c;
  int in_stack_fffffffffffffed0;
  Allocator *in_stack_fffffffffffffed8;
  int local_108;
  Net local_60;
  
  pNVar1 = &local_60;
  ncnn::Net::Net((Net *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  local_60.opt.use_vulkan_compute = true;
  ncnn::Net::load_param(pNVar1,in_stack_fffffffffffffe90);
  ncnn::Net::load_model(pNVar1,in_stack_fffffffffffffe90);
  pNVar1 = (Net *)0x0;
  ncnn::Mat::from_pixels_resize
            ((uchar *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffed8);
  ncnn::Mat::substract_mean_normalize(in_stack_00000340,in_stack_00000338,in_stack_00000330);
  ncnn::Mat::substract_mean_normalize(in_stack_00000340,in_stack_00000338,in_stack_00000330);
  ncnn::Net::create_extractor(in_stack_fffffffffffffe88);
  ncnn::Extractor::input
            (in_stack_fffffffffffffeb8,
             (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (Mat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  ncnn::Mat::Mat((Mat *)&stack0xfffffffffffffec8);
  ncnn::Extractor::extract
            (in_stack_fffffffffffffeb8,
             (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (Mat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             in_stack_fffffffffffffea4);
  std::vector<Object,_std::allocator<Object>_>::clear
            ((vector<Object,_std::allocator<Object>_> *)0x140ad2);
  for (local_13c = 0; local_13c < local_108; local_13c = local_13c + 1) {
    this = (vector<Object,_std::allocator<Object>_> *)
           ncnn::Mat::row((Mat *)&stack0xfffffffffffffec8,local_13c);
    Object::Object((Object *)0x140b14);
    std::vector<Object,_std::allocator<Object>_>::push_back
              (this,(value_type *)in_stack_fffffffffffffe88);
  }
  ncnn::Mat::~Mat((Mat *)0x140c50);
  ncnn::Extractor::~Extractor((Extractor *)pNVar1);
  ncnn::Mat::~Mat((Mat *)0x140c6a);
  ncnn::Net::~Net(pNVar1);
  return 0;
}

Assistant:

static int detect_yolov2(const cv::Mat& bgr, std::vector<Object>& objects)
{
    ncnn::Net yolov2;

    yolov2.opt.use_vulkan_compute = true;

    // original pretrained model from https://github.com/eric612/MobileNet-YOLO
    // https://github.com/eric612/MobileNet-YOLO/blob/master/models/yolov2/mobilenet_yolo_deploy.prototxt
    // https://github.com/eric612/MobileNet-YOLO/blob/master/models/yolov2/mobilenet_yolo_deploy_iter_80000.caffemodel
    // the ncnn model https://github.com/nihui/ncnn-assets/tree/master/models
    yolov2.load_param("mobilenet_yolo.param");
    yolov2.load_model("mobilenet_yolo.bin");

    const int target_size = 416;

    int img_w = bgr.cols;
    int img_h = bgr.rows;

    ncnn::Mat in = ncnn::Mat::from_pixels_resize(bgr.data, ncnn::Mat::PIXEL_BGR, bgr.cols, bgr.rows, target_size, target_size);

    // the Caffe-YOLOv2-Windows style
    // X' = X * scale - mean
    const float mean_vals[3] = {1.0f, 1.0f, 1.0f};
    const float norm_vals[3] = {0.007843f, 0.007843f, 0.007843f};
    in.substract_mean_normalize(0, norm_vals);
    in.substract_mean_normalize(mean_vals, 0);

    ncnn::Extractor ex = yolov2.create_extractor();

    ex.input("data", in);

    ncnn::Mat out;
    ex.extract("detection_out", out);

    //     printf("%d %d %d\n", out.w, out.h, out.c);
    objects.clear();
    for (int i = 0; i < out.h; i++)
    {
        const float* values = out.row(i);

        Object object;
        object.label = values[0];
        object.prob = values[1];
        object.rect.x = values[2] * img_w;
        object.rect.y = values[3] * img_h;
        object.rect.width = values[4] * img_w - object.rect.x;
        object.rect.height = values[5] * img_h - object.rect.y;

        objects.push_back(object);
    }

    return 0;
}